

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O1

void __thiscall StaticSynapse::initialize(StaticSynapse *this,Population *n_from,Population *n_to)

{
  int iVar1;
  uint uVar2;
  assign_op<double,_double> local_31;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_30;
  
  iVar1 = (*n_from->_vptr_Population[1])(n_from);
  this->inputSize = iVar1;
  uVar2 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = uVar2;
  local_30.m_rows.m_value = (long)this->inputSize;
  local_30.m_cols.m_value = (long)(int)uVar2;
  local_30.m_functor.m_other = 0.0;
  if (-1 < (int)(this->inputSize | uVar2)) {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&this->weights,&local_30,&local_31);
    (this->super_Synapse).from_population = n_from;
    (this->super_Synapse).to_population = n_to;
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void StaticSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    weights = Eigen::MatrixXd::Zero(inputSize, outputSize);
    from_population = n_from;
    to_population = n_to;
}